

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O1

char _computeNumberBoolOperation<signed_char>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  int8_t iVar1;
  int8_t iVar2;
  undefined6 in_register_0000003a;
  bool bVar3;
  string local_38;
  
  switch((int)CONCAT62(in_register_0000003a,type)) {
  case 0x46:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar1 == iVar2;
    break;
  case 0x47:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar1 != iVar2;
    break;
  case 0x48:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar1 < iVar2;
    break;
  case 0x49:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar1 <= iVar2;
    break;
  case 0x4a:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar2 < iVar1;
    break;
  case 0x4b:
    iVar1 = pfederc::NumberToken::i8(lhs);
    iVar2 = pfederc::NumberToken::i8(rhs);
    bVar3 = iVar2 <= iVar1;
    break;
  default:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Unknown operation","");
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0xb3,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}